

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

tuple<int,_bool> __thiscall
anon_unknown.dwarf_1510f4::preprocessor<baryonyx::raw_problem>::reduce_less_constraint
          (preprocessor<baryonyx::raw_problem> *this,constraint *constraint)

{
  byte bVar1;
  int iVar2;
  int local_1c;
  int local_18;
  int local_14;
  
  reduce((preprocessor<baryonyx::raw_problem> *)&stack0xffffffffffffffe4,constraint);
  if (local_18 < 0) {
    iVar2 = -1;
    bVar1 = 0;
  }
  else {
    iVar2 = -1;
    if (local_1c < local_14) {
      iVar2 = local_18;
    }
    if (local_1c < 0) {
      iVar2 = local_18;
    }
    if (local_1c < 0 && local_1c < local_14) {
      baryonyx::details::fail_fast
                ("Reached","cond",
                 "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                 ,"262");
    }
    bVar1 = (byte)((uint)local_1c >> 0x1f);
  }
  *(byte *)&this->ctx = bVar1;
  *(int *)((long)&this->ctx + 4) = iVar2;
  return (tuple<int,_bool>)(_Tuple_impl<0UL,_int,_bool>)this;
}

Assistant:

auto reduce_less_constraint(const bx::constraint& constraint)
      -> std::tuple<int, bool>
    {
        int factor, variable, result;

        std::tie(factor, variable, result) = reduce(constraint);

        if (variable < 0)
            return std::make_tuple(-1, false);

        bool affect_0 = (factor * 0 <= result);
        bool affect_1 = (factor * 1 <= result);

        if (affect_0 && affect_1)
            return std::make_tuple(-1, false);

        if (affect_0)
            return std::make_tuple(variable, false);

        if (affect_1)
            return std::make_tuple(variable, true);

        bx_reach();
    }